

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O3

void __thiscall SamplerTest_NextRand_range_Test::TestBody(SamplerTest_NextRand_range_Test *this)

{
  ostream *poVar1;
  char *message;
  int iVar2;
  undefined1 auStack_78 [8];
  Sampler sampler;
  uint64_t max_value;
  uint64_t x;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  auStack_78 = (undefined1  [8])0x0;
  sampler.bytes_until_sample_ = 0;
  sampler.rnd_._0_1_ = 0;
  tcmalloc::Sampler::Init((Sampler *)auStack_78,1);
  sampler.initialized_ = true;
  sampler._17_7_ = 0xffffffffff;
  max_value = 0x80000000000000;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Running sampler.NextRandom 1<<",0x1e);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," times",6);
  iVar2 = 0x400000;
  while( true ) {
    max_value = max_value * 0x5deece66d + 0xb & 0xffffffffffff;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              (local_40,"x","max_value",&max_value,(unsigned_long *)&sampler.initialized_);
    if (local_40[0] == (internal)0x0) break;
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return;
    }
  }
  testing::Message::Message((Message *)&x);
  if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = (local_38->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
             ,0x1a3,message);
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&x);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (x != 0) {
    (**(code **)(*(long *)x + 8))();
  }
  if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38,local_38);
  return;
}

Assistant:

TEST_F(SamplerTest, NextRand_range) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  uint64_t one = 1;
  // The next number should be (one << 48) - 1
  uint64_t max_value = (one << 48) - 1;
  uint64_t x = (one << 55);
  int n = 22;  // 27;
  LOG(INFO) << "Running sampler.NextRandom 1<<" << n << " times";
  for (int i = 1; i <= (1<<n); i++) {  // 20 mimics sampler.Init()
    x = sampler.NextRandom(x);
    ASSERT_LE(x, max_value);
  }
}